

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

uint objgetap0(mcmcxdef *ctx,objnum obj,prpnum prop,objnum *orn,int inh,dattyp *ortyp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  objnum parentnum;
  long lVar5;
  objnum obj_local;
  objnum o1n;
  uint local_c0;
  uint local_bc;
  dattyp typ;
  uint local_b4;
  objnum *local_b0;
  uint *local_a8;
  ulong local_a0;
  uchar sclist [100];
  
  if ((inh == 0) && (local_bc = objgetp(ctx,obj,prop,&typ), local_bc != 0)) {
    if (orn != (objnum *)0x0) {
      *orn = obj;
    }
    if (ortyp != (dattyp *)0x0) {
      *ortyp = typ;
    }
  }
  else {
    local_b4 = (uint)prop;
    local_b0 = orn;
    local_a8 = (uint *)ortyp;
    puVar4 = mcmlck(ctx,obj);
    local_a0 = (ulong)*(ushort *)(puVar4 + 4);
    memcpy(sclist,puVar4 + 0xe,(ulong)((uint)*(ushort *)(puVar4 + 4) * 2));
    mcmunlck(ctx,obj);
    parentnum = 0xffff;
    local_c0 = 5;
    bVar1 = false;
    local_bc = local_c0;
    for (lVar5 = 0; (short)local_a0 != (short)lVar5; lVar5 = lVar5 + 1) {
      uVar2 = objgetap0(ctx,*(objnum *)(sclist + lVar5 * 2),(prpnum)local_b4,&o1n,0,&typ);
      if ((short)uVar2 != 0) {
        if (bVar1) {
          puVar4 = mcmlck(ctx,o1n);
          uVar3 = objisd(ctx,puVar4,parentnum);
          ortyp = (dattyp *)(ulong)uVar3;
          mcmunlck(ctx,o1n);
        }
        if ((int)ortyp != 0 || !bVar1) {
          local_bc = uVar2;
          local_c0 = typ;
          parentnum = o1n;
        }
        bVar1 = true;
      }
    }
    if (local_b0 != (objnum *)0x0) {
      *local_b0 = parentnum;
    }
    if (local_a8 != (uint *)0x0) {
      *local_a8 = local_c0;
    }
    local_bc = local_bc & 0xffff;
    if (!bVar1) {
      local_bc = 0;
    }
  }
  return local_bc;
}

Assistant:

static uint objgetap0(mcmcxdef *ctx, noreg objnum obj, prpnum prop,
                      objnum *orn, int inh, dattyp *ortyp)
{
    uchar  *sc;
    ushort  sccnt;
    ushort  psav;
    dattyp  typsav = DAT_NIL;
    objnum  osavn = MCMONINV;
    uchar  *o1;
    objnum  o1n;
    ushort  poff;
    int     found;
    uint    retval;
    dattyp  typ;
    uchar   sclist[100];                           /* up to 50 superclasses */
    objdef *objptr;
    
    NOREG((&obj))
    
    /* see if the property is in the current object first */
    if (!inh && (retval = objgetp(ctx, obj, prop, &typ)) != 0)
    {
        /* 
         *   tell the caller which object this came from, if the caller
         *   wants to know 
         */
        if (orn != 0)
            *orn = obj;

        /* if the caller wants to know the type, return it */
        if (ortyp != 0)
            *ortyp = typ;

        /* return the property offset */
        return retval;
    }
    
    /* lock the object, cache its superclass list, and unlock it */
    objptr = (objdef *)mcmlck(ctx, (mcmon)obj);
    sccnt = objnsc(objptr);
    memcpy(sclist, objsc(objptr), (size_t)(sccnt << 1));
    sc = sclist;
    mcmunlck(ctx, (mcmon)obj);
    
    /* try to inherit the property */
    for (found = FALSE ; sccnt != 0 ; sc += 2, --sccnt)
    {
        /* recursively look up the property in this superclass */
        poff = objgetap0(ctx, (objnum)osrp2(sc), prop, &o1n, FALSE, &typ);

        /* if we found the property, remember it */
        if (poff != 0)
        {
            int isdesc;
            
            /* if we have a previous object, determine lineage */
            if (found)
            {
                o1 = mcmlck(ctx, o1n);
                isdesc = objisd(ctx, o1, osavn);
                mcmunlck(ctx, o1n);
            }
            
            /*
             *   if we don't already have a property, or the new object
             *   is a descendant of the previously found object (meaning
             *   that the new object's property should override the
             *   previously found object's property), use this new
             *   property 
             */
            if (!found || isdesc)
            {
                psav = poff;
                osavn = o1n;
                typsav = typ;
                found = TRUE;
            }
        }
    }

    /* set return pointer and return the offset of what we found */
    if (orn != 0)
        *orn = osavn;

    /* return the object type if the caller wanted it */
    if (ortyp != 0)
        *ortyp = typsav;

    /* return the offset of the property if we found one, or zero if not */
    return (found ? psav : 0);
}